

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFactorySystem.h
# Opt level: O2

void __thiscall ObjectFactorySystem::ObjectFactorySystem(ObjectFactorySystem *this)

{
  *(code **)this = __assert_fail;
  *(undefined4 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(ObjectFactorySystem **)(this + 0x20) = this + 0x10;
  *(ObjectFactorySystem **)(this + 0x28) = this + 0x10;
  *(undefined4 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(ObjectFactorySystem **)(this + 0x68) = this + 0x58;
  *(ObjectFactorySystem **)(this + 0x70) = this + 0x58;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  this[0x90] = (ObjectFactorySystem)0x1;
  *(undefined8 *)(this + 0x94) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined8 *)(this + 0xb0) = 0;
  return;
}

Assistant:

ObjectFactorySystem()
		: m_pLogger( 0 )
		, m_pRuntimeObjectSystem( 0 )
        , m_bTestSerialization(true)
		, m_HistoryMaxSize( 0 )
		, m_HistoryCurrentLocation( 0 )
 	{
	}